

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall
FSpecialFont::FSpecialFont
          (FSpecialFont *this,char *name,int first,int count,FTexture **lumplist,bool *notranslate,
          int lump)

{
  double dVar1;
  FTexture *sourcelump;
  int iVar2;
  char *pcVar3;
  CharData *pCVar4;
  BYTE *pBVar5;
  FFontChar1 *this_00;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  
  (this->super_FFont).Ranges.Array = (FRemapTable *)0x0;
  (this->super_FFont).Ranges.Most = 0;
  (this->super_FFont).Ranges.Count = 0;
  (this->super_FFont).Lump = lump;
  (this->super_FFont).Chars = (CharData *)0x0;
  (this->super_FFont).PatchRemap = (BYTE *)0x0;
  (this->super_FFont).Name = (char *)0x0;
  (this->super_FFont).Cursor = '_';
  (this->super_FFont)._vptr_FFont = (_func_int **)&PTR__FFont_006ff1f0;
  memcpy(this->notranslate,notranslate,0x100);
  pcVar3 = copystring(name);
  (this->super_FFont).Name = pcVar3;
  uVar9 = 0xffffffffffffffff;
  if (-1 < count) {
    uVar9 = (ulong)(uint)count << 4;
  }
  pCVar4 = (CharData *)operator_new__(uVar9);
  (this->super_FFont).Chars = pCVar4;
  pBVar5 = (BYTE *)operator_new__(0x100);
  (this->super_FFont).PatchRemap = pBVar5;
  (this->super_FFont).FirstChar = first;
  (this->super_FFont).LastChar = first + count + -1;
  (this->super_FFont).FontHeight = 0;
  (this->super_FFont).GlobalKerning = 0;
  (this->super_FFont).Next = FFont::FirstFont;
  FFont::FirstFont = &this->super_FFont;
  if (0 < count) {
    lVar10 = 0;
    do {
      sourcelump = *(FTexture **)((long)lumplist + lVar10);
      if (sourcelump == (FTexture *)0x0) {
        *(undefined8 *)((long)&pCVar4->Pic + lVar10 * 2) = 0;
        iVar2 = -0x80000000;
      }
      else {
        dVar1 = (sourcelump->Scale).Y;
        uVar6 = (uint)((double)((uint)sourcelump->Height * 2) / dVar1);
        uVar7 = (uint)((double)(sourcelump->TopOffset * 2) / dVar1);
        iVar8 = (uVar7 & 1) + ((int)uVar7 >> 1);
        iVar2 = -iVar8;
        if (0 < iVar8) {
          iVar2 = iVar8;
        }
        iVar2 = iVar2 + (uVar6 & 1) + ((int)uVar6 >> 1);
        if ((this->super_FFont).FontHeight < iVar2) {
          (this->super_FFont).FontHeight = iVar2;
        }
        this_00 = (FFontChar1 *)operator_new(0x70);
        FFontChar1::FFontChar1(this_00,sourcelump);
        pCVar4 = (this->super_FFont).Chars;
        *(FFontChar1 **)((long)&pCVar4->Pic + lVar10 * 2) = this_00;
        uVar6 = (uint)((double)((uint)(this_00->super_FTexture).Width * 2) /
                      (this_00->super_FTexture).Scale.X);
        iVar2 = (uVar6 & 1) + ((int)uVar6 >> 1);
      }
      *(int *)((long)&pCVar4->XMove + lVar10 * 2) = iVar2;
      lVar10 = lVar10 + 8;
    } while ((ulong)(uint)count << 3 != lVar10);
  }
  uVar6 = 0x4e - first;
  iVar2 = 4;
  if (((int)uVar6 < count && first < 0x4f) && (pCVar4[uVar6].Pic != (FTexture *)0x0)) {
    iVar2 = (pCVar4[uVar6].XMove - (pCVar4[uVar6].XMove + 1 >> 0x1f)) + 1 >> 1;
  }
  (this->super_FFont).SpaceWidth = iVar2;
  FFont::FixXMoves(&this->super_FFont);
  (*(this->super_FFont)._vptr_FFont[4])(this);
  return;
}

Assistant:

FSpecialFont::FSpecialFont (const char *name, int first, int count, FTexture **lumplist, const bool *notranslate, int lump) : FFont(lump)
{
	int i;
	FTexture **charlumps;
	int maxyoffs;
	FTexture *pic;

	memcpy(this->notranslate, notranslate, 256*sizeof(bool));

	Name = copystring(name);
	Chars = new CharData[count];
	charlumps = new FTexture*[count];
	PatchRemap = new BYTE[256];
	FirstChar = first;
	LastChar = first + count - 1;
	FontHeight = 0;
	GlobalKerning = false;
	Next = FirstFont;
	FirstFont = this;

	maxyoffs = 0;

	for (i = 0; i < count; i++)
	{
		pic = charlumps[i] = lumplist[i];
		if (pic != NULL)
		{
			int height = pic->GetScaledHeight();
			int yoffs = pic->GetScaledTopOffset();

			if (yoffs > maxyoffs)
			{
				maxyoffs = yoffs;
			}
			height += abs (yoffs);
			if (height > FontHeight)
			{
				FontHeight = height;
			}
		}

		if (charlumps[i] != NULL)
		{
			Chars[i].Pic = new FFontChar1 (charlumps[i]);
			Chars[i].XMove = Chars[i].Pic->GetScaledWidth();
		}
		else
		{
			Chars[i].Pic = NULL;
			Chars[i].XMove = INT_MIN;
		}
	}

	// Special fonts normally don't have all characters so be careful here!
	if ('N'-first >= 0 && 'N'-first < count && Chars['N' - first].Pic != NULL)
	{
		SpaceWidth = (Chars['N' - first].XMove + 1) / 2;
	}
	else
	{
		SpaceWidth = 4;
	}

	FixXMoves();

	LoadTranslations();

	delete[] charlumps;
}